

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnArrayType
          (BinaryReaderIR *this,Index index,TypeMut type_mut)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Module *pMVar3;
  long *plVar4;
  undefined8 uVar5;
  pointer *__ptr;
  undefined1 local_58 [48];
  
  GetLocation((Location *)(local_58 + 0x10),this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_58);
  std::make_unique<wabt::ArrayType>();
  uVar5 = local_58._16_8_;
  *(Type *)(local_58._16_8_ + 0x70) = type_mut.type;
  *(byte *)(local_58._16_8_ + 0x78) = type_mut.mutable_ & 1;
  pMVar3 = this->module_;
  paVar1 = &pMVar3->features_used;
  paVar1->simd = (bool)(paVar1->simd | type_mut.type.enum_ == V128);
  pbVar2 = &(pMVar3->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | type_mut.type.enum_ == ExnRef);
  local_58._16_8_ = 0;
  plVar4 = *(long **)(local_58._0_8_ + 0x40);
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(local_58._0_8_ + 0x40)
  )->offset = uVar5;
  local_58._8_8_ = local_58._0_8_;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
    local_58._8_8_ = local_58._0_8_;
  }
  local_58._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)(local_58 + 8));
  if ((long *)local_58._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._8_8_ + 8))();
  }
  local_58._8_8_ = (char *)0x0;
  if (local_58._16_8_ != 0) {
    (**(code **)(*(long *)local_58._16_8_ + 8))();
  }
  if ((long *)local_58._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnArrayType(Index index, TypeMut type_mut) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto array_type = std::make_unique<ArrayType>();
  array_type->field.type = type_mut.type;
  array_type->field.mutable_ = type_mut.mutable_;
  module_->features_used.simd |= (type_mut.type == Type::V128);
  module_->features_used.exceptions |= (type_mut.type == Type::ExnRef);
  field->type = std::move(array_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}